

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void * hd_resize_array(hd_context *ctx,void *p,size_t count,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  char *fmt;
  
  if (count == 0 || size == 0) {
    (*ctx->alloc->free)(ctx->alloc->user,p);
    return (void *)0x0;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = count;
  if (SUB168(auVar1 * auVar2,8) == 0) {
    pvVar3 = (*ctx->alloc->realloc)(ctx->alloc->user,p,size * count);
    if (pvVar3 != (void *)0x0) {
      return pvVar3;
    }
    fmt = "resize array (%zu x %zu bytes) failed";
  }
  else {
    fmt = "resize array (%zu x %zu bytes) failed (size_t overflow)";
  }
  hd_throw(ctx,1,fmt,count,size);
}

Assistant:

void *
hd_resize_array(hd_context *ctx, void *p, size_t count, size_t size)
{
    void *np;

    if (count == 0 || size == 0)
    {
        hd_free(ctx, p);
        return 0;
    }

    if (count > SIZE_MAX / size)
        hd_throw(ctx, HD_ERROR_MEMORY, "resize array (%zu x %zu bytes) failed (size_t overflow)", count, size);

    np = do_scavenging_realloc(ctx, p, count * size);
    if (!np)
        hd_throw(ctx, HD_ERROR_MEMORY, "resize array (%zu x %zu bytes) failed", count, size);
    return np;
}